

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::ParseSubjectKeyIdentifierTest_Valid_Test::TestBody
          (ParseSubjectKeyIdentifierTest_Valid_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Input *in_RCX;
  char *in_R9;
  Input extension_value;
  AssertHelper local_e0;
  Message local_d8;
  Span<const_unsigned_char> local_d0;
  Input local_c0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_80 [3];
  Message local_68;
  Span<const_unsigned_char> local_60;
  Input local_50;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  Input subject_key_identifier;
  uint8_t kExpected [2];
  uint8_t kInput [4];
  ParseSubjectKeyIdentifierTest_Valid_Test *this_local;
  
  subject_key_identifier.data_.size_._4_4_ = 0xcdab0204;
  subject_key_identifier.data_.size_._2_2_ = 0xcdab;
  bssl::der::Input::Input((Input *)&gtest_ar_.message_);
  Span<unsigned_char_const>::Span<4ul>
            ((Span<unsigned_char_const> *)&local_60,
             (uchar (*) [4])((long)&subject_key_identifier.data_.size_ + 4));
  bssl::der::Input::Input(&local_50,local_60);
  extension_value.data_.size_ = (size_t)&gtest_ar_.message_;
  extension_value.data_.data_ = (uchar *)local_50.data_.size_;
  local_39 = ParseSubjectKeyIdentifier((bssl *)local_50.data_.data_,extension_value,in_RCX);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_38,
               (AssertionResult *)
               "ParseSubjectKeyIdentifier(der::Input(kInput), &subject_key_identifier)","false",
               "true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
               ,0x49a,pcVar2);
    testing::internal::AssertHelper::operator=(local_80,&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  Span<unsigned_char_const>::Span<2ul>
            ((Span<unsigned_char_const> *)&local_d0,
             (uchar (*) [2])((long)&subject_key_identifier.data_.size_ + 2));
  bssl::der::Input::Input(&local_c0,local_d0);
  testing::internal::EqHelper::Compare<bssl::der::Input,_bssl::der::Input,_nullptr>
            ((EqHelper *)local_b0,"der::Input(kExpected)","subject_key_identifier",&local_c0,
             (Input *)&gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
               ,0x49b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST(ParseSubjectKeyIdentifierTest, Valid) {
  // OCTET_STRING {`abcd`}
  const uint8_t kInput[] = {0x04, 0x02, 0xab, 0xcd};
  const uint8_t kExpected[] = {0xab, 0xcd};
  der::Input subject_key_identifier;
  EXPECT_TRUE(
      ParseSubjectKeyIdentifier(der::Input(kInput), &subject_key_identifier));
  EXPECT_EQ(der::Input(kExpected), subject_key_identifier);
}